

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O1

int point_mul_two_id_GostR3410_2001_TestParamSet
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *output;
  uint64_t *puVar1;
  uint64_t *out1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  bool bVar12;
  pt_prj_t_conflict Q;
  uchar b_y [32];
  uchar b_x [32];
  uchar b_m [32];
  uchar b_n [32];
  pt_aff_t_conflict P;
  int8_t bnaf [257];
  int8_t anaf [257];
  pt_prj_t_conflict precomp [16];
  pt_prj_t_conflict local_978;
  uint8_t local_918 [32];
  uint8_t local_8f8 [32];
  uchar local_8d8 [32];
  uchar local_8b8 [32];
  pt_aff_t_conflict local_898;
  byte local_858 [272];
  byte local_748 [272];
  pt_prj_t_conflict local_638 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  pBVar8 = BN_CTX_get((BN_CTX *)ctx);
  iVar5 = 0;
  iVar6 = 0;
  if (((((pBVar8 != (BIGNUM *)0x0) &&
        (iVar4 = EC_POINT_get_affine_coordinates(group,q,pBVar7,pBVar8,ctx), iVar6 = iVar5,
        iVar4 != 0)) && (iVar5 = BN_bn2lebinpad(pBVar7,local_8f8,0x20), iVar5 == 0x20)) &&
      ((iVar5 = BN_bn2lebinpad(pBVar8,local_918,0x20), iVar5 == 0x20 &&
       (iVar5 = BN_bn2lebinpad(n,local_8b8,0x20), iVar5 == 0x20)))) &&
     (iVar5 = BN_bn2lebinpad(m,local_8d8,0x20), iVar5 == 0x20)) {
    fiat_id_GostR3410_2001_TestParamSet_from_bytes(local_898.X,local_8f8);
    puVar1 = local_898.Y;
    fiat_id_GostR3410_2001_TestParamSet_from_bytes(puVar1,local_918);
    fiat_id_GostR3410_2001_TestParamSet_to_montgomery(local_898.X,local_898.X);
    fiat_id_GostR3410_2001_TestParamSet_to_montgomery(puVar1,puVar1);
    bVar10 = 0;
    memset(local_748,0,0x101);
    memset(local_858,0,0x101);
    local_978.Z[2] = 0;
    local_978.Z[3] = 0;
    local_978.Z[0] = 0;
    local_978.Z[1] = 0;
    local_978.Y[2] = 0;
    local_978.Y[3] = 0;
    local_978.Y[0] = 0;
    local_978.Y[1] = 0;
    local_978.X[2] = 0;
    local_978.X[3] = 0;
    local_978.X[0] = 0;
    local_978.X[1] = 0;
    precomp_wnaf(local_638,&local_898);
    scalar_wnaf((int8_t *)local_748,local_8b8);
    scalar_wnaf((int8_t *)local_858,local_8d8);
    bVar3 = true;
    lVar11 = 0x100;
    do {
      if (!bVar3) {
        point_double(&local_978,&local_978);
      }
      bVar2 = local_858[lVar11];
      if (bVar2 != 0) {
        if (bVar10 != bVar2 >> 7) {
          fiat_id_GostR3410_2001_TestParamSet_opp(local_978.Y,local_978.Y);
          bVar10 = bVar10 ^ 1;
        }
        uVar9 = (int)((int)(char)bVar2 - 1U) >> 1;
        if ((char)bVar2 < '\0') {
          uVar9 = (uint)~(int)(char)bVar2 >> 1;
        }
        if (bVar3) {
          local_978.X[0] = local_638[(int)uVar9].X[0];
          local_978.X[1] = local_638[(int)uVar9].X[1];
          local_978.X[2] = local_638[(int)uVar9].X[2];
          local_978.X[3] = local_638[(int)uVar9].X[3];
          local_978.Y[0] = local_638[(int)uVar9].Y[0];
          local_978.Y[1] = local_638[(int)uVar9].Y[1];
          local_978.Y[2] = local_638[(int)uVar9].Y[2];
          local_978.Y[3] = local_638[(int)uVar9].Y[3];
          local_978.Z[2] = local_638[(int)uVar9].Z[2];
          local_978.Z[3] = local_638[(int)uVar9].Z[3];
          local_978.Z[0] =
               CONCAT44(*(undefined4 *)((long)local_638[(int)uVar9].Z + 4),
                        (int)local_638[(int)uVar9].Z[0]);
          local_978.Z[1] =
               CONCAT44(*(undefined4 *)((long)local_638[(int)uVar9].Z + 0xc),
                        (int)local_638[(int)uVar9].Z[1]);
        }
        else {
          point_add_proj(&local_978,&local_978,local_638 + (int)uVar9);
        }
        bVar3 = false;
      }
      bVar2 = local_748[lVar11];
      if (bVar2 != 0) {
        if (bVar10 != bVar2 >> 7) {
          fiat_id_GostR3410_2001_TestParamSet_opp(local_978.Y,local_978.Y);
          bVar10 = bVar10 ^ 1;
        }
        uVar9 = (int)((int)(char)bVar2 - 1U) >> 1;
        if ((char)bVar2 < '\0') {
          uVar9 = (uint)~(int)(char)bVar2 >> 1;
        }
        if (bVar3) {
          local_978.X[0] = lut_cmb[0][(int)uVar9].X[0];
          local_978.X[1] = lut_cmb[0][(int)uVar9].X[1];
          local_978.X[2] = lut_cmb[0][(int)uVar9].X[2];
          local_978.X[3] = lut_cmb[0][(int)uVar9].X[3];
          local_978.Y[0] = lut_cmb[0][(int)uVar9].Y[0];
          local_978.Y[1] = lut_cmb[0][(int)uVar9].Y[1];
          local_978.Y[2] = lut_cmb[0][(int)uVar9].Y[2];
          local_978.Y[3] = lut_cmb[0][(int)uVar9].Y[3];
          local_978.Z[0] = 0xfffffffffffffbcf;
          local_978.Z[1] = 0xffffffffffffffff;
          local_978.Z[2] = 0xffffffffffffffff;
          local_978.Z[3] = 0x7fffffffffffffff;
        }
        else {
          point_add_mixed(&local_978,&local_978,lut_cmb[0] + (int)uVar9);
        }
        bVar3 = false;
      }
      bVar12 = lVar11 != 0;
      lVar11 = lVar11 + -1;
    } while (bVar12);
    puVar1 = local_978.Y;
    if (bVar3) {
      local_978.X[2] = 0;
      local_978.X[3] = 0;
      local_978.X[0] = 0;
      local_978.X[1] = 0;
      local_978.Y[2] = 0xffffffffffffffff;
      local_978.Y[3] = 0x7fffffffffffffff;
      local_978.Y[0] = 0xfffffffffffffbcf;
      local_978.Y[1] = 0xffffffffffffffff;
      local_978.Z[0] = 0;
      local_978.Z[1] = 0;
      local_978.Z[2] = 0;
      local_978.Z[3] = 0;
    }
    if (bVar10 != 0) {
      fiat_id_GostR3410_2001_TestParamSet_opp(puVar1,puVar1);
    }
    output = local_978.Z;
    fiat_id_GostR3410_2001_TestParamSet_inv(output,output);
    fiat_id_GostR3410_2001_TestParamSet_mul(local_898.X,local_978.X,output);
    out1 = local_898.Y;
    fiat_id_GostR3410_2001_TestParamSet_mul(out1,puVar1,output);
    fiat_id_GostR3410_2001_TestParamSet_from_montgomery(local_898.X,local_898.X);
    fiat_id_GostR3410_2001_TestParamSet_from_montgomery(out1,out1);
    fiat_id_GostR3410_2001_TestParamSet_to_bytes(local_8f8,local_898.X);
    fiat_id_GostR3410_2001_TestParamSet_to_bytes(local_918,out1);
    iVar6 = CRYPTO_memcmp("",local_8f8,0x20);
    if ((iVar6 == 0) && (iVar6 = CRYPTO_memcmp("",local_918,0x20), iVar6 == 0)) {
      iVar6 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar6 == 0) {
        iVar6 = 0;
        goto LAB_0012cf88;
      }
    }
    else {
      lVar11 = BN_lebin2bn(local_8f8,0x20,pBVar7);
      iVar6 = 0;
      if ((lVar11 == 0) ||
         ((lVar11 = BN_lebin2bn(local_918,0x20,pBVar8), lVar11 == 0 ||
          (iVar5 = EC_POINT_set_affine_coordinates(group,r,pBVar7,pBVar8,ctx), iVar5 == 0))))
      goto LAB_0012cf88;
    }
    iVar6 = 1;
  }
LAB_0012cf88:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar6;
}

Assistant:

int
    point_mul_two_id_GostR3410_2001_TestParamSet(const EC_GROUP *group,
                                                 EC_POINT *r, const BIGNUM *n,
                                                 const EC_POINT *q,
                                                 const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_n[32];
    unsigned char b_m[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 32) != 32 || BN_bn2lebinpad(y, b_y, 32) != 32 ||
        BN_bn2lebinpad(n, b_n, 32) != 32 || BN_bn2lebinpad(m, b_m, 32) != 32)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}